

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O3

Gem_Man_t * Gem_ManAlloc(int nVars,int fVerbose)

{
  size_t __size;
  word wVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  Gem_Man_t *p;
  Gem_Obj_t *pGVar5;
  word *pwVar6;
  Vec_Mem_t *p_00;
  Vec_Int_t *pVVar7;
  int *piVar8;
  word **ppwVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  int iVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0x5a,"Gem_Man_t *Gem_ManAlloc(int, int)");
  }
  p = (Gem_Man_t *)calloc(1,0x30);
  uVar15 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar15 = 1;
  }
  p->nVars = nVars;
  p->nWords = uVar15;
  p->nObjsAlloc = 10000000;
  p->nObjs = 2;
  pGVar5 = (Gem_Obj_t *)calloc(10000000,8);
  p->pObjs = pGVar5;
  *(undefined4 *)(pGVar5 + 1) = 0x10001;
  __size = (ulong)uVar15 * 8;
  pwVar6 = (word *)malloc(__size);
  p_00 = (Vec_Mem_t *)calloc(1,0x30);
  p_00->nEntrySize = uVar15;
  p_00->LogPageSze = 0xc;
  p_00->PageMask = 0xfff;
  p_00->iPage = -1;
  uVar12 = 9999;
  while( true ) {
    do {
      uVar11 = uVar12;
      uVar12 = uVar11 + 1;
    } while ((uVar11 & 1) != 0);
    if (uVar12 < 9) break;
    iVar10 = 5;
    while (uVar12 % (iVar10 - 2U) != 0) {
      uVar4 = iVar10 * iVar10;
      iVar10 = iVar10 + 2;
      if (uVar12 < uVar4) goto LAB_0048d158;
    }
  }
LAB_0048d158:
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar11) {
    uVar4 = uVar12;
  }
  pVVar7->nCap = uVar4;
  piVar8 = (int *)malloc((long)(int)uVar4 << 2);
  pVVar7->pArray = piVar8;
  pVVar7->nSize = uVar12;
  if (piVar8 != (int *)0x0) {
    memset(piVar8,0xff,(long)(int)uVar12 << 2);
  }
  p_00->vTable = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 10000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(40000);
  pVVar7->pArray = piVar8;
  p_00->vNexts = pVVar7;
  memset(pwVar6,0,__size);
  iVar10 = Vec_MemHashInsert(p_00,pwVar6);
  if (iVar10 != 0) {
    __assert_fail("Value == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                  ,0x19e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  memset(pwVar6,0xaa,__size);
  iVar10 = Vec_MemHashInsert(p_00,pwVar6);
  if (iVar10 != 1) {
    __assert_fail("Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                  ,0x1a3,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  if (pwVar6 != (word *)0x0) {
    free(pwVar6);
  }
  p->vTtMem = p_00;
  ppwVar9 = (word **)Extra_ArrayAlloc(nVars + 4,uVar15,8);
  p->pTtElems = ppwVar9;
  p->fVerbose = fVerbose;
  auVar3 = _DAT_0094e250;
  auVar2 = _DAT_0094e240;
  if (0 < nVars) {
    uVar13 = (ulong)(uVar15 + 1 & 0xfffffffe);
    lVar19 = (ulong)uVar15 - 1;
    auVar17._8_4_ = (int)lVar19;
    auVar17._0_8_ = lVar19;
    auVar17._12_4_ = (int)((ulong)lVar19 >> 0x20);
    uVar14 = 0;
    auVar17 = auVar17 ^ _DAT_0094e250;
    do {
      iVar10 = auVar17._4_4_;
      iVar18 = auVar17._12_4_;
      if (uVar14 < 6) {
        wVar1 = s_Truths6[uVar14];
        pwVar6 = ppwVar9[uVar14];
        uVar16 = 0;
        auVar21 = auVar2;
        do {
          auVar20 = auVar21 ^ auVar3;
          if ((bool)(~(auVar20._4_4_ == iVar10 && auVar17._0_4_ < auVar20._0_4_ ||
                      iVar10 < auVar20._4_4_) & 1)) {
            pwVar6[uVar16] = wVar1;
          }
          if ((auVar20._12_4_ != iVar18 || auVar20._8_4_ <= auVar17._8_4_) &&
              auVar20._12_4_ <= iVar18) {
            pwVar6[uVar16 + 1] = wVar1;
          }
          uVar16 = uVar16 + 2;
          lVar19 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 2;
          auVar21._8_8_ = lVar19 + 2;
        } while (uVar13 != uVar16);
      }
      else {
        uVar15 = 1 << ((char)uVar14 - 6U & 0x1f);
        pwVar6 = ppwVar9[uVar14];
        uVar16 = 0;
        auVar20 = auVar2;
        do {
          auVar21 = auVar20 ^ auVar3;
          if ((bool)(~(auVar21._4_4_ == iVar10 && auVar17._0_4_ < auVar21._0_4_ ||
                      iVar10 < auVar21._4_4_) & 1)) {
            pwVar6[uVar16] = -(ulong)((uVar15 & (uint)uVar16) != 0);
          }
          if ((auVar21._12_4_ != iVar18 || auVar21._8_4_ <= auVar17._8_4_) &&
              auVar21._12_4_ <= iVar18) {
            pwVar6[uVar16 + 1] = -(ulong)(((uint)uVar16 + 1 & uVar15) != 0);
          }
          uVar16 = uVar16 + 2;
          lVar19 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 2;
          auVar20._8_8_ = lVar19 + 2;
        } while (uVar13 != uVar16);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uint)nVars);
  }
  Gem_PrintNode(p,1,"Original",0);
  return p;
}

Assistant:

Gem_Man_t * Gem_ManAlloc( int nVars, int fVerbose )
{
    Gem_Man_t * p;
    assert( nVars <= 16 );
    p = ABC_CALLOC( Gem_Man_t, 1 );
    p->nVars      = nVars;
    p->nWords     = Abc_TtWordNum( nVars );
    p->nObjsAlloc = 10000000;
    p->nObjs      = 2;
    p->pObjs      = ABC_CALLOC( Gem_Obj_t, p->nObjsAlloc );
    p->pObjs[1].nVars = p->pObjs[1].Groups = 1; // buffer
    p->vTtMem     = Vec_MemAllocForTT( nVars, 0 );
    p->pTtElems   = (word **)Extra_ArrayAlloc( nVars + 4, p->nWords, sizeof(word) );
    p->fVerbose   = fVerbose;
    Abc_TtElemInit( p->pTtElems, nVars );
    Gem_PrintNode( p, 1, "Original", 0 );
    return p;
}